

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall parser::Parser::expand(Parser *this)

{
  reference pvVar1;
  bool bVar2;
  Operator local_198;
  undefined1 local_148 [8];
  Operator e;
  allocator<char> local_e1;
  string local_e0;
  Operator local_c0;
  PRECENDENCE local_6c;
  pair<int,_Operator> local_68;
  Parser *local_10;
  Parser *this_local;
  
  local_6c = BASE;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e1);
  Operator::Operator(&local_c0,NULLTOKEN,&local_e0);
  std::pair<int,_Operator>::pair<ast::PRECENDENCE,_Operator,_true>(&local_68,&local_6c,&local_c0);
  std::
  stack<std::pair<int,_Operator>,_std::deque<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>_>
  ::push(&this->Operators,&local_68);
  std::pair<int,_Operator>::~pair(&local_68);
  Operator::~Operator(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  produce(this);
  binary((Operator *)local_148,this,(this->peekToken).Type);
  while ((int)e.super_Token._vptr_Token != 0x129) {
    nextToken(this);
    pushOperator(this,(Operator *)local_148,true);
    nextToken(this);
    produce(this);
    binary(&local_198,this,(this->peekToken).Type);
    Operator::operator=((Operator *)local_148,&local_198);
    Operator::~Operator(&local_198);
  }
  while( true ) {
    pvVar1 = std::
             stack<std::pair<int,_Operator>,_std::deque<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>_>
             ::top(&this->Operators);
    bVar2 = false;
    if ((pvVar1->second).super_Token.Type != ERROR) {
      pvVar1 = std::
               stack<std::pair<int,_Operator>,_std::deque<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>_>
               ::top(&this->Operators);
      bVar2 = (pvVar1->second).super_Token.Type != NULLTOKEN;
    }
    if (!bVar2) break;
    popOperator(this,true);
  }
  std::
  stack<std::pair<int,_Operator>,_std::deque<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>_>
  ::pop(&this->Operators);
  Operator::~Operator((Operator *)local_148);
  return;
}

Assistant:

void Parser::expand()
{
    Operators.push({PRECENDENCE::BASE, Operator(TokenType::NULLTOKEN, "")});
    produce();
    auto e = binary(peekToken.Type);
    while(e.Type != TokenType::ERROR)
    {
        nextToken();
        pushOperator(e, true);
        nextToken();
        produce();
        e = binary(peekToken.Type);
    }
    while(Operators.top().second.Type != TokenType::ERROR &&
          Operators.top().second.Type != TokenType::NULLTOKEN)
    {
        popOperator(true);
    }
    Operators.pop();

}